

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void aom_get_var_sse_sum_8x8_quad_c
               (uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse8x8,int *sum8x8,
               uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
    variance(a,a_stride,b,b_stride,8,8,(uint32_t *)((long)sse8x8 + lVar1),
             (int *)((long)sum8x8 + lVar1));
    b = b + 8;
    a = a + 8;
  }
  *tot_sse = *tot_sse + sse8x8[3] + sse8x8[1] + sse8x8[2] + *sse8x8;
  *tot_sum = *tot_sum + sum8x8[3] + sum8x8[1] + sum8x8[2] + *sum8x8;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    var8x8[lVar1] = sse8x8[lVar1] - (int)((ulong)((long)sum8x8[lVar1] * (long)sum8x8[lVar1]) >> 6);
  }
  return;
}

Assistant:

void aom_get_var_sse_sum_8x8_quad_c(const uint8_t *a, int a_stride,
                                    const uint8_t *b, int b_stride,
                                    uint32_t *sse8x8, int *sum8x8,
                                    unsigned int *tot_sse, int *tot_sum,
                                    uint32_t *var8x8) {
  // Loop over 4 8x8 blocks. Process one 8x32 block.
  for (int k = 0; k < 4; k++) {
    variance(a + (k * 8), a_stride, b + (k * 8), b_stride, 8, 8, &sse8x8[k],
             &sum8x8[k]);
  }

  // Calculate variance at 8x8 level and total sse, sum of 8x32 block.
  *tot_sse += sse8x8[0] + sse8x8[1] + sse8x8[2] + sse8x8[3];
  *tot_sum += sum8x8[0] + sum8x8[1] + sum8x8[2] + sum8x8[3];
  for (int i = 0; i < 4; i++)
    var8x8[i] = sse8x8[i] - (uint32_t)(((int64_t)sum8x8[i] * sum8x8[i]) >> 6);
}